

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O0

bool __thiscall pgn::find_move<(Piece)3>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  U8 UVar1;
  Square SVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Square SVar7;
  Move *pMVar8;
  uint local_3d8;
  uint local_3d4;
  uint local_3d0 [3];
  int local_3c4;
  byte local_3bd;
  int j;
  bool promotion;
  undefined1 local_3b0 [8];
  Movegen mvs;
  int col_local;
  int row_local;
  Move *m_local;
  Square *to_local;
  position *p_local;
  pgn *this_local;
  
  mvs.eps = col;
  mvs._884_4_ = row;
  Movegen::Movegen((Movegen *)local_3b0,p);
  Movegen::generate<(Piece)3>((Movegen *)local_3b0);
  local_3bd = m->type != '\x11';
  local_3c4 = 0;
  do {
    iVar6 = local_3c4;
    iVar5 = Movegen::size((Movegen *)local_3b0);
    if (iVar5 <= iVar6) {
      this_local._7_1_ = false;
LAB_0014a332:
      local_3d0[1] = 1;
      Movegen::~Movegen((Movegen *)local_3b0);
      return this_local._7_1_;
    }
    pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
    bVar4 = position::is_legal(p,pMVar8);
    if (bVar4) {
      if ((((local_3bd & 1) == 0) ||
          (UVar1 = m->type, pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4),
          UVar1 != pMVar8->type)) ||
         (pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4), uVar3 = mvs._884_4_,
         (uint)pMVar8->t != *to)) {
        if (((local_3bd & 1) == 0) &&
           (pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4), uVar3 = mvs._884_4_,
           (uint)pMVar8->t == *to)) {
          bVar4 = false;
          if (-1 < (int)mvs._884_4_) {
            pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
            local_3d4 = (uint)pMVar8->f;
            iVar6 = util::row((int *)&local_3d4);
            bVar4 = uVar3 == iVar6;
          }
          SVar2 = mvs.eps;
          if (bVar4) {
            pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
            Move::operator=(m,pMVar8);
            this_local._7_1_ = true;
            goto LAB_0014a332;
          }
          bVar4 = false;
          if (-1 < (int)mvs.eps) {
            pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
            local_3d8 = (uint)pMVar8->f;
            SVar7 = util::col((int *)&local_3d8);
            bVar4 = SVar2 == SVar7;
          }
          if (bVar4) {
            pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
            Move::operator=(m,pMVar8);
            this_local._7_1_ = true;
            goto LAB_0014a332;
          }
          if (((int)mvs.eps < 0) && ((int)mvs._884_4_ < 0)) {
            pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
            Move::operator=(m,pMVar8);
            this_local._7_1_ = true;
            goto LAB_0014a332;
          }
        }
      }
      else {
        bVar4 = false;
        if (-1 < (int)mvs._884_4_) {
          pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
          local_3d0[2] = (uint)pMVar8->f;
          iVar6 = util::row((int *)(local_3d0 + 2));
          bVar4 = uVar3 == iVar6;
        }
        SVar2 = mvs.eps;
        if (bVar4) {
          pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
          Move::operator=(m,pMVar8);
          this_local._7_1_ = true;
          goto LAB_0014a332;
        }
        bVar4 = false;
        if (-1 < (int)mvs.eps) {
          pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
          local_3d0[0] = (uint)pMVar8->f;
          SVar7 = util::col((int *)local_3d0);
          bVar4 = SVar2 == SVar7;
        }
        if (bVar4) {
          pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
          Move::operator=(m,pMVar8);
          this_local._7_1_ = true;
          goto LAB_0014a332;
        }
        if (((int)mvs.eps < 0) && ((int)mvs._884_4_ < 0)) {
          pMVar8 = Movegen::operator[]((Movegen *)local_3b0,&local_3c4);
          Move::operator=(m,pMVar8);
          this_local._7_1_ = true;
          goto LAB_0014a332;
        }
      }
    }
    local_3c4 = local_3c4 + 1;
  } while( true );
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}